

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_matcher.c
# Opt level: O3

_Bool TokenMatcher_match_Comment(TokenMatcher *token_matcher,Token *token)

{
  _Bool _Var1;
  wchar_t *text;
  
  if (token == (Token *)0x0) {
    return false;
  }
  if ((token->line != (GherkinLine_conflict *)0x0) &&
     (_Var1 = GherkinLine_start_with((GherkinLine *)token->line,L"#"), _Var1)) {
    text = GherkinLine_copy_line_text((GherkinLine *)token->line,L'\0');
    set_token_matched(token,Token_Comment,text,(wchar_t *)0x0,Keyword_Type_None,L'\0',(Items *)0x0);
    return true;
  }
  return false;
}

Assistant:

bool TokenMatcher_match_Comment(TokenMatcher* token_matcher, Token* token) {
    if (!token || !token->line)
        return false;
    if (GherkinLine_start_with(token->line, L"#")) {
        wchar_t* text = GherkinLine_copy_line_text(token->line, 0);
        set_token_matched(token, Token_Comment, text, 0, Keyword_Type_None, 0, 0);
        return true;
    }
    return false;
}